

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas0.cpp
# Opt level: O0

void r4mat_print(int m,int n,float *a,string *title)

{
  string local_40;
  string *local_20;
  string *title_local;
  float *a_local;
  int n_local;
  int m_local;
  
  local_20 = title;
  title_local = (string *)a;
  a_local._0_4_ = n;
  a_local._4_4_ = m;
  std::__cxx11::string::string((string *)&local_40,(string *)title);
  r4mat_print_some(m,n,a,1,1,m,n,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void r4mat_print ( int m, int n, float a[], string title )

//****************************************************************************80
//
//  Purpose:
//
//    R4MAT_PRINT prints an R4MAT.
//
//  Discussion:
//
//    An R4MAT is a doubly dimensioned array of R4 values, stored as a vector
//    in column-major order.
//
//    Entry A(I,J) is stored as A[I+J*M]
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    10 September 2009
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int M, the number of rows in A.
//
//    Input, int N, the number of columns in A.
//
//    Input, float A[M*N], the M by N matrix.
//
//    Input, string TITLE, a title.
//
{
  r4mat_print_some ( m, n, a, 1, 1, m, n, title );

  return;
}